

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac-sha1.c
# Opt level: O2

void hmac_sha1(uint8_t *key,size_t key_len,uint8_t *message,size_t message_len,uint8_t *digest)

{
  int i;
  long lVar1;
  uint8_t fixed_key [64];
  uint8_t inner_digest [20];
  uint8_t outer_pad [64];
  uint8_t inner_pad [64];
  sha1_ctx ctx;
  
  fixed_key[0] = '\0';
  fixed_key[1] = '\0';
  fixed_key[2] = '\0';
  fixed_key[3] = '\0';
  fixed_key[4] = '\0';
  fixed_key[5] = '\0';
  fixed_key[6] = '\0';
  fixed_key[7] = '\0';
  fixed_key[8] = '\0';
  fixed_key[9] = '\0';
  fixed_key[10] = '\0';
  fixed_key[0xb] = '\0';
  fixed_key[0xc] = '\0';
  fixed_key[0xd] = '\0';
  fixed_key[0xe] = '\0';
  fixed_key[0xf] = '\0';
  fixed_key[0x10] = '\0';
  fixed_key[0x11] = '\0';
  fixed_key[0x12] = '\0';
  fixed_key[0x13] = '\0';
  fixed_key[0x14] = '\0';
  fixed_key[0x15] = '\0';
  fixed_key[0x16] = '\0';
  fixed_key[0x17] = '\0';
  fixed_key[0x18] = '\0';
  fixed_key[0x19] = '\0';
  fixed_key[0x1a] = '\0';
  fixed_key[0x1b] = '\0';
  fixed_key[0x1c] = '\0';
  fixed_key[0x1d] = '\0';
  fixed_key[0x1e] = '\0';
  fixed_key[0x1f] = '\0';
  fixed_key[0x20] = '\0';
  fixed_key[0x21] = '\0';
  fixed_key[0x22] = '\0';
  fixed_key[0x23] = '\0';
  fixed_key[0x24] = '\0';
  fixed_key[0x25] = '\0';
  fixed_key[0x26] = '\0';
  fixed_key[0x27] = '\0';
  fixed_key[0x28] = '\0';
  fixed_key[0x29] = '\0';
  fixed_key[0x2a] = '\0';
  fixed_key[0x2b] = '\0';
  fixed_key[0x2c] = '\0';
  fixed_key[0x2d] = '\0';
  fixed_key[0x2e] = '\0';
  fixed_key[0x2f] = '\0';
  fixed_key[0x30] = '\0';
  fixed_key[0x31] = '\0';
  fixed_key[0x32] = '\0';
  fixed_key[0x33] = '\0';
  fixed_key[0x34] = '\0';
  fixed_key[0x35] = '\0';
  fixed_key[0x36] = '\0';
  fixed_key[0x37] = '\0';
  fixed_key[0x38] = '\0';
  fixed_key[0x39] = '\0';
  fixed_key[0x3a] = '\0';
  fixed_key[0x3b] = '\0';
  fixed_key[0x3c] = '\0';
  fixed_key[0x3d] = '\0';
  fixed_key[0x3e] = '\0';
  fixed_key[0x3f] = '\0';
  if (key_len < 0x41) {
    memcpy(fixed_key,key,key_len);
  }
  else {
    sha1_init(&ctx);
    sha1_update(&ctx,key,(uint32_t)key_len);
    sha1_finalise(&ctx,fixed_key);
  }
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
    inner_pad[lVar1] = fixed_key[lVar1] ^ 0x36;
    outer_pad[lVar1] = fixed_key[lVar1] ^ 0x5c;
  }
  sha1_init(&ctx);
  sha1_update(&ctx,inner_pad,0x40);
  sha1_update(&ctx,message,(uint32_t)message_len);
  sha1_finalise(&ctx,inner_digest);
  sha1_init(&ctx);
  sha1_update(&ctx,outer_pad,0x40);
  sha1_update(&ctx,inner_digest,0x14);
  sha1_finalise(&ctx,digest);
  return;
}

Assistant:

void hmac_sha1(const uint8_t *key, size_t key_len, const uint8_t *message,
               size_t message_len, uint8_t digest[20]) {
  struct sha1_ctx ctx;
  uint8_t fixed_key[64];
  uint8_t inner_digest[20];
  uint8_t inner_pad[64];
  uint8_t outer_pad[64];

  memset(fixed_key, 0, 64);
  if (key_len > 64) {
    sha1_init(&ctx);
    sha1_update(&ctx, (const uint8_t *)key, key_len);
    sha1_finalise(&ctx, fixed_key);
  } else {
    memcpy(fixed_key, key, key_len > 64 ? 64 : key_len);
  }

  for (int i = 0; i < 64; i++) {
    inner_pad[i] = fixed_key[i] ^ 0x36;
    outer_pad[i] = fixed_key[i] ^ 0x5c;
  }

  // perform inner hash
  sha1_init(&ctx);
  sha1_update(&ctx, inner_pad, 64);
  sha1_update(&ctx, message, message_len);
  sha1_finalise(&ctx, inner_digest);

  sha1_init(&ctx);
  sha1_update(&ctx, outer_pad, 64);
  sha1_update(&ctx, inner_digest, 20);
  sha1_finalise(&ctx, digest);
}